

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ps_int((int *)&DAT_001051f0,10);
  sort_5_4::merge_sort_1((int *)&DAT_001051f0,0,9);
}

Assistant:

int main() {
    try {
        //    ds_1::run();//大话数据结构
//    ds_22::run();//啊哈！算法
//    ds_3::run();//妙趣横生的算法
//    ds_4::test();//数据结构与算法分析
//    ds_5::test();//数据结构 one
//    ds_5_1::test();//数据结构 two
//    sort_5_2::test();
//        run_3::test();
        r4::test();
        return 0;
    } catch (...) {
        std::cout << "catch (...)" << std::endl;

    }

}